

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_to_hir.cpp
# Opt level: O0

bool validate_xfb_offset_qualifier
               (YYLTYPE *loc,_mesa_glsl_parse_state *state,int xfb_offset,glsl_type *type,
               uint component_size)

{
  glsl_type *this;
  bool bVar1;
  glsl_type *this_00;
  int xfb_offset_1;
  glsl_type *member_t;
  uint i;
  glsl_type *t_without_array;
  uint component_size_local;
  glsl_type *type_local;
  int xfb_offset_local;
  _mesa_glsl_parse_state *state_local;
  YYLTYPE *loc_local;
  
  this_00 = glsl_type::without_array(type);
  if ((xfb_offset == -1) || (bVar1 = glsl_type::is_unsized_array(type), !bVar1)) {
    bVar1 = glsl_type::is_struct(this_00);
    t_without_array._4_4_ = component_size;
    if ((bVar1) || (bVar1 = glsl_type::is_interface(this_00), bVar1)) {
      for (member_t._4_4_ = 0; member_t._4_4_ < this_00->length; member_t._4_4_ = member_t._4_4_ + 1
          ) {
        this = *(glsl_type **)((this_00->fields).array + member_t._4_4_);
        if (xfb_offset == -1) {
          bVar1 = glsl_type::contains_double(this);
          t_without_array._4_4_ = 4;
          if (bVar1) {
            t_without_array._4_4_ = 8;
          }
        }
        validate_xfb_offset_qualifier
                  (loc,state,*(int *)((long)&(this_00->fields).array[member_t._4_4_].name + 4),this,
                   t_without_array._4_4_);
      }
    }
    if (xfb_offset == -1) {
      loc_local._7_1_ = true;
    }
    else if ((uint)xfb_offset % t_without_array._4_4_ == 0) {
      loc_local._7_1_ = true;
    }
    else {
      _mesa_glsl_error(loc,state,
                       "invalid qualifier xfb_offset=%d must be a multiple of the first component size of the first qualified variable or block member. Or double if an aggregate that contains a double (%d)."
                       ,(ulong)(uint)xfb_offset,(ulong)t_without_array._4_4_);
      loc_local._7_1_ = false;
    }
  }
  else {
    _mesa_glsl_error(loc,state,"xfb_offset can\'t be used with unsized arrays.");
    loc_local._7_1_ = false;
  }
  return loc_local._7_1_;
}

Assistant:

static bool
validate_xfb_offset_qualifier(YYLTYPE *loc,
                              struct _mesa_glsl_parse_state *state,
                              int xfb_offset, const glsl_type *type,
                              unsigned component_size) {
  const glsl_type *t_without_array = type->without_array();

   if (xfb_offset != -1 && type->is_unsized_array()) {
      _mesa_glsl_error(loc, state,
                       "xfb_offset can't be used with unsized arrays.");
      return false;
   }

   /* Make sure nested structs don't contain unsized arrays, and validate
    * any xfb_offsets on interface members.
    */
   if (t_without_array->is_struct() || t_without_array->is_interface())
      for (unsigned int i = 0; i < t_without_array->length; i++) {
         const glsl_type *member_t = t_without_array->fields.structure[i].type;

         /* When the interface block doesn't have an xfb_offset qualifier then
          * we apply the component size rules at the member level.
          */
         if (xfb_offset == -1)
            component_size = member_t->contains_double() ? 8 : 4;

         int xfb_offset = t_without_array->fields.structure[i].offset;
         validate_xfb_offset_qualifier(loc, state, xfb_offset, member_t,
                                       component_size);
      }

  /* Nested structs or interface block without offset may not have had an
   * offset applied yet so return.
   */
   if (xfb_offset == -1) {
     return true;
   }

   if (xfb_offset % component_size) {
      _mesa_glsl_error(loc, state,
                       "invalid qualifier xfb_offset=%d must be a multiple "
                       "of the first component size of the first qualified "
                       "variable or block member. Or double if an aggregate "
                       "that contains a double (%d).",
                       xfb_offset, component_size);
      return false;
   }

   return true;
}